

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

LOs __thiscall Omega_h::get_degrees(Omega_h *this,LOs *offsets,string *name)

{
  void **this_00;
  void *extraout_RDX;
  LOs LVar1;
  Write<int> local_a8 [2];
  undefined1 local_88 [8];
  type f;
  Write<int> degrees;
  string *name_local;
  LOs *offsets_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(offsets->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((offsets->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(offsets->write_).shared_alloc_.alloc >> 3;
  }
  this_00 = &f.offsets.write_.shared_alloc_.direct_ptr;
  Write<int>::Write((Write<int> *)this_00,(int)(local_10 >> 2) + -1,name);
  Write<int>::Write((Write<int> *)local_88,(Write<int> *)this_00);
  Read<int>::Read((Read<int> *)&f.degrees.shared_alloc_.direct_ptr,offsets);
  if (((ulong)f.offsets.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_20 = *f.offsets.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_20 = (ulong)f.offsets.write_.shared_alloc_.direct_ptr >> 3;
  }
  parallel_for<Omega_h::get_degrees(Omega_h::Read<int>,std::__cxx11::string_const&)::__0>
            ((LO)(local_20 >> 2),(type *)local_88,"get_degrees");
  Write<int>::Write(local_a8,(Write<int> *)&f.offsets.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)this,local_a8);
  Write<int>::~Write(local_a8);
  get_degrees(Omega_h::Read<int>,std::__cxx11::string_const&)::$_0::~__0((__0 *)local_88);
  Write<int>::~Write((Write<int> *)&f.offsets.write_.shared_alloc_.direct_ptr);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs get_degrees(LOs offsets, std::string const& name) {
  Write<LO> degrees(offsets.size() - 1, name);
  auto f = OMEGA_H_LAMBDA(LO i) { degrees[i] = offsets[i + 1] - offsets[i]; };
  parallel_for(degrees.size(), f, "get_degrees");
  return degrees;
}